

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_range_benchmark.c
# Opt level: O2

_Bool naive_intersect(void *base,testvalue_t tv)

{
  _Bool _Var1;
  roaring_bitmap_t *x2;
  
  x2 = roaring_bitmap_from_range((ulong)tv.range[0],(ulong)tv.range[1],1);
  _Var1 = roaring_bitmap_intersect(tv.bitmap,x2);
  roaring_bitmap_free(x2);
  return _Var1;
}

Assistant:

static bool naive_intersect(void *base, testvalue_t tv) {
    (void)base;
    const roaring_bitmap_t *bm = tv.bitmap;
    roaring_bitmap_t *range =
        roaring_bitmap_from_range(tv.range[0], tv.range[1], 1);
    bool res = roaring_bitmap_intersect(bm, range);
    roaring_bitmap_free(range);
    return res;
}